

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O2

void __thiscall
dtc::anon_unknown_1::ternary_conditional_operator::dump_impl(ternary_conditional_operator *this)

{
  (*((this->cond)._M_t.
     super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
     ._M_t.
     super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
     .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)->
    _vptr_expression[4])();
  std::operator<<((ostream *)&std::cerr," ? ");
  (*((this->lhs)._M_t.
     super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
     ._M_t.
     super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
     .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)->
    _vptr_expression[4])();
  std::operator<<((ostream *)&std::cerr," : ");
  (*((this->rhs)._M_t.
     super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
     ._M_t.
     super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
     .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)->
    _vptr_expression[4])();
  return;
}

Assistant:

void dump_impl() override
	{
		cond->dump();
		std::cerr << " ? ";
		lhs->dump();
		std::cerr << " : ";
		rhs->dump();
	}